

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

QPixmap * __thiscall
QMap<Qt::DropAction,_QPixmap>::operator[](QMap<Qt::DropAction,_QPixmap> *this,DropAction *key)

{
  bool bVar1;
  pointer ppVar2;
  pair<const_Qt::DropAction,_QPixmap> *in_RSI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_Qt::DropAction,_QPixmap>_>,_bool> pVar3;
  iterator i;
  QMap<Qt::DropAction,_QPixmap> copy;
  map<Qt::DropAction,_QPixmap,_std::less<Qt::DropAction>,_std::allocator<std::pair<const_Qt::DropAction,_QPixmap>_>_>
  *in_stack_ffffffffffffff48;
  QPixmap *pQVar4;
  QMap<Qt::DropAction,_QPixmap> *in_stack_ffffffffffffff50;
  map<Qt::DropAction,_QPixmap,_std::less<Qt::DropAction>,_std::allocator<std::pair<const_Qt::DropAction,_QPixmap>_>_>
  *this_00;
  map<Qt::DropAction,_QPixmap,_std::less<Qt::DropAction>,_std::allocator<std::pair<const_Qt::DropAction,_QPixmap>_>_>
  local_68;
  _Self local_30;
  _Self local_28;
  undefined1 *local_20;
  _Base_ptr local_18;
  undefined1 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  bVar1 = QtPrivate::
          QExplicitlySharedDataPointerV2<QMapData<std::map<Qt::DropAction,_QPixmap,_std::less<Qt::DropAction>,_std::allocator<std::pair<const_Qt::DropAction,_QPixmap>_>_>_>_>
          ::isShared(&in_stack_ffffffffffffff50->d);
  if (bVar1) {
    QMap(in_stack_ffffffffffffff50,(QMap<Qt::DropAction,_QPixmap> *)in_stack_ffffffffffffff48);
  }
  else {
    memset(&local_20,0,8);
    QMap((QMap<Qt::DropAction,_QPixmap> *)0x98274f);
  }
  detach(in_stack_ffffffffffffff50);
  local_28._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<Qt::DropAction,_QPixmap,_std::less<Qt::DropAction>,_std::allocator<std::pair<const_Qt::DropAction,_QPixmap>_>_>_>_>
  ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<Qt::DropAction,_QPixmap,_std::less<Qt::DropAction>,_std::allocator<std::pair<const_Qt::DropAction,_QPixmap>_>_>_>_>
                *)0x982772);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<Qt::DropAction,_QPixmap,_std::less<Qt::DropAction>,_std::allocator<std::pair<const_Qt::DropAction,_QPixmap>_>_>
       ::find(in_stack_ffffffffffffff48,(key_type *)0x982783);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<Qt::DropAction,_QPixmap,_std::less<Qt::DropAction>,_std::allocator<std::pair<const_Qt::DropAction,_QPixmap>_>_>_>_>
  ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<Qt::DropAction,_QPixmap,_std::less<Qt::DropAction>,_std::allocator<std::pair<const_Qt::DropAction,_QPixmap>_>_>_>_>
                *)0x982795);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<Qt::DropAction,_QPixmap,_std::less<Qt::DropAction>,_std::allocator<std::pair<const_Qt::DropAction,_QPixmap>_>_>
       ::end(in_stack_ffffffffffffff48);
  bVar1 = std::operator==(&local_28,&local_30);
  if (bVar1) {
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<Qt::DropAction,_QPixmap,_std::less<Qt::DropAction>,_std::allocator<std::pair<const_Qt::DropAction,_QPixmap>_>_>_>_>
    ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<Qt::DropAction,_QPixmap,_std::less<Qt::DropAction>,_std::allocator<std::pair<const_Qt::DropAction,_QPixmap>_>_>_>_>
                  *)0x9827d1);
    this_00 = &local_68;
    QPixmap::QPixmap((QPixmap *)in_RSI);
    std::pair<const_Qt::DropAction,_QPixmap>::pair<QPixmap,_true>
              (in_RSI,(DropAction *)in_stack_ffffffffffffff48,(QPixmap *)0x98280c);
    pVar3 = std::
            map<Qt::DropAction,_QPixmap,_std::less<Qt::DropAction>,_std::allocator<std::pair<const_Qt::DropAction,_QPixmap>_>_>
            ::insert(this_00,in_RSI);
    local_28._M_node = (_Base_ptr)pVar3.first._M_node;
    local_10 = pVar3.second;
    local_18 = local_28._M_node;
    std::pair<const_Qt::DropAction,_QPixmap>::~pair((pair<const_Qt::DropAction,_QPixmap> *)0x982856)
    ;
    QPixmap::~QPixmap((QPixmap *)in_RSI);
  }
  ppVar2 = std::_Rb_tree_iterator<std::pair<const_Qt::DropAction,_QPixmap>_>::operator->
                     ((_Rb_tree_iterator<std::pair<const_Qt::DropAction,_QPixmap>_> *)0x98286d);
  pQVar4 = &ppVar2->second;
  ~QMap((QMap<Qt::DropAction,_QPixmap> *)0x982882);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return pQVar4;
}

Assistant:

T &operator[](const Key &key)
    {
        const auto copy = d.isShared() ? *this : QMap(); // keep `key` alive across the detach
        detach();
        auto i = d->m.find(key);
        if (i == d->m.end())
            i = d->m.insert({key, T()}).first;
        return i->second;
    }